

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O3

string * __thiscall
wabt::(anonymous_namespace)::TypesToString_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,TypeVector *types,char *prefix
          )

{
  ulong uVar1;
  string *psVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"[","");
  if (types != (TypeVector *)0x0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  lVar4 = *(long *)this;
  if (*(long *)(this + 8) != lVar4) {
    lVar3 = 0;
    uVar5 = 0;
    do {
      if (*(ulong *)(lVar4 + lVar3) < 0xffffffff00000000 || (int)*(ulong *)(lVar4 + lVar3) != -0x15)
      {
        Type::GetName_abi_cxx11_(&local_50,(Type *)(lVar4 + lVar3));
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_50._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      lVar4 = *(long *)this;
      uVar1 = *(long *)(this + 8) - lVar4 >> 3;
      if (uVar5 < uVar1 - 1) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        lVar4 = *(long *)this;
        uVar1 = *(long *)(this + 8) - lVar4 >> 3;
      }
      uVar5 = uVar5 + 1;
      lVar3 = lVar3 + 8;
    } while (uVar5 < uVar1);
  }
  psVar2 = (string *)std::__cxx11::string::append((char *)__return_storage_ptr__);
  return psVar2;
}

Assistant:

std::string TypesToString(const TypeVector& types,
                          const char* prefix = nullptr) {
  std::string result = "[";
  if (prefix) {
    result += prefix;
  }

  for (size_t i = 0; i < types.size(); ++i) {
    Type ty = types[i];
    // NOTE: Reference (and GetName) is also used by (e.g.) objdump, which does
    // not apply validation. do this here so as to not break that.
    if (ty == Type::Reference && ty.GetReferenceIndex() == kInvalidIndex) {
      result += "reference";
    } else {
      result += types[i].GetName();
    }
    if (i < types.size() - 1) {
      result += ", ";
    }
  }
  result += "]";
  return result;
}